

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ini.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  sx_alloc *alloc;
  sx_ini *ini;
  char *pcVar3;
  char *pcVar4;
  int i;
  int iVar5;
  int k;
  
  alloc = sx_alloc_malloc();
  ini = sx_ini_load("global_var=hello world\n[general]\nscreen_width=12\nscreen_height=64\ndata_path=/usr/septag\n; some comment about this section\n[sx]\nis_library=1\n"
                    ,alloc);
  if (ini == (sx_ini *)0x0) {
    puts("Loading ini data failed");
    iVar5 = -1;
  }
  else {
    iVar5 = 0;
    while( true ) {
      iVar1 = sx_ini_section_count(ini);
      if (iVar1 <= iVar5) break;
      pcVar3 = sx_ini_section_name(ini,iVar5);
      iVar1 = 0;
      printf("Section: %s\n",pcVar3);
      while( true ) {
        iVar2 = sx_ini_property_count(ini,iVar5);
        if (iVar2 <= iVar1) break;
        pcVar3 = sx_ini_property_name(ini,iVar5,iVar1);
        pcVar4 = sx_ini_property_value(ini,iVar5,iVar1);
        printf("\t%s = %s\n",pcVar3,pcVar4);
        iVar1 = iVar1 + 1;
      }
      iVar5 = iVar5 + 1;
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int main(int argc, char* argv[])
{
    const sx_alloc* alloc = sx_alloc_malloc();
    sx_ini* ini = sx_ini_load(ini_data, alloc);
    if (!ini) {
        puts("Loading ini data failed");
        return -1;
    }

    for (int i = 0; i < sx_ini_section_count(ini); i++) {
        printf("Section: %s\n", sx_ini_section_name(ini, i));
        for (int k = 0; k < sx_ini_property_count(ini, i); k++) {
            printf("\t%s = %s\n", sx_ini_property_name(ini, i, k),
                   sx_ini_property_value(ini, i, k));
        }
    }

    return 0;
}